

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O3

Status __thiscall leveldb::anon_unknown_1::PosixWritableFile::Sync(PosixWritableFile *this)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  int *piVar5;
  _func_int **pp_Var6;
  long in_RSI;
  long *__s;
  string dir;
  Status local_78;
  string local_70;
  Slice local_50;
  char local_40 [16];
  
  __s = *(long **)(in_RSI + 8);
  pcVar3 = strrchr((char *)__s,0x2f);
  local_50.size_ = 0;
  local_40[0] = '\0';
  local_50.data_ = local_40;
  if (pcVar3 == (char *)0x0) {
    std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)0x0,0x121a16);
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,__s,pcVar3);
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    __s = (long *)(pcVar3 + 1);
  }
  sVar4 = strlen((char *)__s);
  (this->super_WritableFile)._vptr_WritableFile = (_func_int **)0x0;
  if ((7 < sVar4) && (*__s == 0x54534546494e414d)) {
    iVar1 = open(local_50.data_,0);
    if (-1 < iVar1) {
      iVar2 = fsync(iVar1);
      if (iVar2 < 0) {
        __errno_location();
        IOError(&local_70,(int)local_50.data_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) goto LAB_001201dc;
        pp_Var6 = (_func_int **)Status::CopyState(local_70._M_dataplus._M_p);
        (this->super_WritableFile)._vptr_WritableFile = pp_Var6;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete__(local_70._M_dataplus._M_p);
        }
      }
      else {
LAB_001201dc:
        pp_Var6 = (_func_int **)0x0;
      }
      close(iVar1);
      goto LAB_00120103;
    }
    __errno_location();
    IOError(&local_70,(int)local_50.data_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pp_Var6 = (_func_int **)Status::CopyState(local_70._M_dataplus._M_p);
      (this->super_WritableFile)._vptr_WritableFile = pp_Var6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete__(local_70._M_dataplus._M_p);
      }
      goto LAB_00120103;
    }
  }
  pp_Var6 = (_func_int **)0x0;
LAB_00120103:
  if (local_50.data_ != local_40) {
    operator_delete(local_50.data_);
  }
  if (pp_Var6 == (_func_int **)0x0) {
    iVar1 = fflush_unlocked(*(FILE **)(in_RSI + 0x28));
    if (iVar1 == 0) {
      iVar1 = fileno(*(FILE **)(in_RSI + 0x28));
      iVar1 = fdatasync(iVar1);
      if (iVar1 == 0) {
        return (Status)(char *)this;
      }
    }
    local_50.data_ = *(char **)(in_RSI + 8);
    local_50.size_ = *(size_t *)(in_RSI + 0x10);
    piVar5 = __errno_location();
    local_70._M_dataplus._M_p = strerror(*piVar5);
    local_70._M_string_length = strlen(local_70._M_dataplus._M_p);
    Status::Status(&local_78,kIOError,&local_50,(Slice *)&local_70);
    if (local_78.state_ != (char *)0x0) {
      pp_Var6 = (_func_int **)Status::CopyState(local_78.state_);
      (this->super_WritableFile)._vptr_WritableFile = pp_Var6;
      if (local_78.state_ != (char *)0x0) {
        operator_delete__(local_78.state_);
      }
    }
  }
  return (Status)(char *)this;
}

Assistant:

virtual Status Sync() {
                // Ensure new files referred to by the manifest are in the filesystem.
                Status s = SyncDirIfManifest();
                if (!s.ok()) {
                    return s;
                }
                if (fflush_unlocked(file_) != 0 ||
                    fdatasync(fileno(file_)) != 0) {
                    s = Status::IOError(filename_, strerror(errno));
                }
                return s;
            }